

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

Statement * __thiscall SQASTReader::readStatement(SQASTReader *this)

{
  bool bVar1;
  Node *this_00;
  SQASTReader *in_RDI;
  Node *n;
  
  this_00 = readNullable((SQASTReader *)n);
  if ((this_00 != (Node *)0x0) &&
     (bVar1 = SQCompilation::Node::isStatementOrDeclaration(this_00), bVar1)) {
    return (Statement *)this_00;
  }
  error(in_RDI,"Expected non-null statement node");
  return (Statement *)this_00;
}

Assistant:

Statement *SQASTReader::readStatement() {
  Node *n = readNullable();

  if (!n || !n->isStatementOrDeclaration()) {
    error("Expected non-null statement node");
  }

  return (Statement *)n;
}